

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

bool __thiscall metaf::VisibilityGroup::isVariable(VisibilityGroup *this)

{
  Type TVar1;
  VisibilityGroup *in_RDI;
  
  TVar1 = type(in_RDI);
  return TVar1 - VARIABLE_PREVAILING < 5;
}

Assistant:

bool isVariable() const {
		switch (type()) {
			case Type::VARIABLE_PREVAILING:
			case Type::VARIABLE_DIRECTIONAL:
			case Type::VARIABLE_RUNWAY:
			case Type::VARIABLE_RVR:
			case Type::VARIABLE_SECTOR:
			return true;

			default: return false;
		}
	}